

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  u8 *puVar4;
  ushort uVar5;
  u16 uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int lineno;
  ulong uVar12;
  uint uVar13;
  u8 *local_68;
  u8 *local_60;
  
  puVar4 = pPage->aData;
  uVar8 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar3 = pPage->pBt->usableSize;
  uVar7 = (uint)uVar1 + (uint)uVar2 * 2;
  local_68 = (u8 *)0x0;
  uVar13 = uVar3;
  local_60 = puVar4;
  for (uVar12 = 0; uVar2 != uVar12; uVar12 = uVar12 + 1) {
    uVar5 = *(ushort *)(puVar4 + uVar12 * 2 + (ulong)uVar1) << 8 |
            *(ushort *)(puVar4 + uVar12 * 2 + (ulong)uVar1) >> 8;
    lineno = 0xd3a8;
    if ((uVar5 < uVar7) ||
       (uVar9 = (uint)uVar5, uVar9 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar5))
    goto LAB_001337d7;
    uVar6 = cellSizePtr(pPage,local_60 + uVar9);
    uVar10 = uVar13 - uVar6;
    lineno = 0xd3b4;
    if (((int)uVar10 < (int)uVar7) || ((int)uVar3 < (int)((uint)uVar5 + (uint)uVar6)))
    goto LAB_001337d7;
    *(ushort *)(puVar4 + uVar12 * 2 + (ulong)uVar1) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    if (local_68 == (u8 *)0x0) {
      if (uVar10 != uVar9) {
        local_68 = (u8 *)pPage->pBt->pPager->pTmpSpace;
        uVar5 = *(ushort *)(puVar4 + uVar8 + 5) << 8 | *(ushort *)(puVar4 + uVar8 + 5) >> 8;
        memcpy(local_68 + uVar5,puVar4 + uVar5,(long)(int)(uVar13 - uVar5));
        local_60 = local_68;
        goto LAB_00133766;
      }
      local_68 = (u8 *)0x0;
    }
    else {
LAB_00133766:
      memcpy(puVar4 + uVar10,local_60 + uVar9,(ulong)uVar6);
    }
    uVar13 = uVar10;
  }
  *(ushort *)(puVar4 + uVar8 + 5) = (ushort)uVar13 << 8 | (ushort)uVar13 >> 8;
  (puVar4 + uVar8 + 1)[0] = '\0';
  (puVar4 + uVar8 + 1)[1] = '\0';
  puVar4[uVar8 + 7] = '\0';
  iVar11 = 0;
  memset(puVar4 + uVar7,0,(long)(int)(uVar13 - uVar7));
  lineno = 0xd3cd;
  if (uVar13 - uVar7 != (uint)pPage->nFree) {
LAB_001337d7:
    sqlite3CorruptError(lineno);
    iVar11 = 0xb;
  }
  return iVar11;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &src[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}